

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::path::input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
          (input_iterator_range<ghc::filesystem::path::iterator> *this,iterator *first,
          iterator *last)

{
  iterator *last_local;
  iterator *first_local;
  input_iterator_range<ghc::filesystem::path::iterator> *this_local;
  
  path::iterator::iterator(&this->_first,first);
  path::iterator::iterator(&this->_last,last);
  return;
}

Assistant:

input_iterator_range(const InputIterator& first, const InputIterator& last)
            : _first(first)
            , _last(last)
        {
        }